

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall
node::anon_unknown_2::NotificationsHandlerImpl::disconnect(NotificationsHandlerImpl *this)

{
  ValidationSignals *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks;
  shared_ptr<CValidationInterface> sStack_48;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_proxy).
      super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    this_00 = this->m_signals;
    std::shared_ptr<CValidationInterface>::
    shared_ptr<node::(anonymous_namespace)::NotificationsProxy,void>(&sStack_48,&this->m_proxy);
    callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = extraout_RDX._M_pi;
    callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&sStack_48;
    ValidationSignals::UnregisterSharedValidationInterface(this_00,callbacks);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sStack_48.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_38 = (this->m_proxy).
               super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    a_Stack_30[0]._M_pi =
         (this->m_proxy).
         super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    (this->m_proxy).
    super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->m_proxy).
    super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void disconnect() override
    {
        if (m_proxy) {
            m_signals.UnregisterSharedValidationInterface(m_proxy);
            m_proxy.reset();
        }
    }